

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_thread_getaffinity(uv_thread_t *tid,char *cpumask,size_t mask_size)

{
  uint uVar1;
  int iVar2;
  size_t __cpu;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  cpu_set_t cpuset;
  
  uVar1 = uv_cpumask_size();
  if (-1 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
    if (mask_size < uVar4) {
      uVar1 = 0xffffffea;
    }
    else {
      cpuset.__bits[0xe] = 0;
      cpuset.__bits[0xf] = 0;
      cpuset.__bits[0xc] = 0;
      cpuset.__bits[0xd] = 0;
      cpuset.__bits[10] = 0;
      cpuset.__bits[0xb] = 0;
      cpuset.__bits[8] = 0;
      cpuset.__bits[9] = 0;
      cpuset.__bits[6] = 0;
      cpuset.__bits[7] = 0;
      cpuset.__bits[4] = 0;
      cpuset.__bits[5] = 0;
      cpuset.__bits[2] = 0;
      cpuset.__bits[3] = 0;
      cpuset.__bits[0] = 0;
      cpuset.__bits[1] = 0;
      iVar2 = pthread_getaffinity_np(*tid,0x80,(cpu_set_t *)&cpuset);
      if (iVar2 == 0) {
        uVar1 = 0;
        for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          if (uVar3 < 0x400) {
            bVar5 = (cpuset.__bits[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0;
          }
          else {
            bVar5 = false;
          }
          cpumask[uVar3] = bVar5;
        }
      }
      else {
        uVar1 = -iVar2;
      }
    }
  }
  return uVar1;
}

Assistant:

int uv_thread_getaffinity(uv_thread_t* tid,
                          char* cpumask,
                          size_t mask_size) {
  int r;
  int i;
  uv__cpu_set_t cpuset;
  int cpumasksize;

  cpumasksize = uv_cpumask_size();
  if (cpumasksize < 0)
    return cpumasksize;
  if (mask_size < (size_t)cpumasksize)
    return UV_EINVAL;

  CPU_ZERO(&cpuset);
#if defined(__ANDROID__)
  if (sched_getaffinity(pthread_gettid_np(*tid), sizeof(cpuset), &cpuset))
    r = errno;
  else
    r = 0;
#else
  r = pthread_getaffinity_np(*tid, sizeof(cpuset), &cpuset);
#endif
  if (r)
    return UV__ERR(r);
  for (i = 0; i < cpumasksize; i++)
    cpumask[i] = !!CPU_ISSET(i, &cpuset);

  return 0;
}